

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t driver::zesRasClearStateExp(zes_ras_handle_t hRas,zes_ras_error_category_exp_t category)

{
  ze_result_t zVar1;
  
  if (DAT_0010ed98 != (code *)0x0) {
    zVar1 = (*DAT_0010ed98)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasClearStateExp(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        zes_ras_error_category_exp_t category           ///< [in] category for which error counter is to be cleared.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnClearStateExp = context.zesDdiTable.RasExp.pfnClearStateExp;
        if( nullptr != pfnClearStateExp )
        {
            result = pfnClearStateExp( hRas, category );
        }
        else
        {
            // generic implementation
        }

        return result;
    }